

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O2

spvc_result
spvc_compiler_msl_remap_constexpr_sampler_by_binding
          (spvc_compiler compiler,uint desc_set,uint binding,spvc_msl_constexpr_sampler *sampler)

{
  CompilerMSL *this;
  spvc_context_s *this_00;
  spvc_result sVar1;
  string local_b0;
  MSLConstexprSampler samp;
  
  if (compiler->backend == SPVC_BACKEND_MSL) {
    this = (CompilerMSL *)
           (compiler->compiler)._M_t.
           super___uniq_ptr_impl<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>
           ._M_t.
           super__Tuple_impl<0UL,_spirv_cross::Compiler_*,_std::default_delete<spirv_cross::Compiler>_>
           .super__Head_base<0UL,_spirv_cross::Compiler_*,_false>._M_head_impl;
    spirv_cross::MSLConstexprSampler::MSLConstexprSampler(&samp);
    spvc_convert_msl_sampler(&samp,sampler);
    spirv_cross::CompilerMSL::remap_constexpr_sampler_by_binding(this,desc_set,binding,&samp);
    sVar1 = SPVC_SUCCESS;
  }
  else {
    this_00 = compiler->context;
    std::__cxx11::string::string
              ((string *)&local_b0,"MSL function used on a non-MSL backend.",(allocator *)&samp);
    spvc_context_s::report_error(this_00,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    sVar1 = SPVC_ERROR_INVALID_ARGUMENT;
  }
  return sVar1;
}

Assistant:

spvc_result spvc_compiler_msl_remap_constexpr_sampler_by_binding(spvc_compiler compiler,
                                                                 unsigned desc_set, unsigned binding,
                                                                 const spvc_msl_constexpr_sampler *sampler)
{
#if SPIRV_CROSS_C_API_MSL
	if (compiler->backend != SPVC_BACKEND_MSL)
	{
		compiler->context->report_error("MSL function used on a non-MSL backend.");
		return SPVC_ERROR_INVALID_ARGUMENT;
	}

	auto &msl = *static_cast<CompilerMSL *>(compiler->compiler.get());
	MSLConstexprSampler samp;
	spvc_convert_msl_sampler(samp, sampler);
	msl.remap_constexpr_sampler_by_binding(desc_set, binding, samp);
	return SPVC_SUCCESS;
#else
	(void)desc_set;
	(void)binding;
	(void)sampler;
	compiler->context->report_error("MSL function used on a non-MSL backend.");
	return SPVC_ERROR_INVALID_ARGUMENT;
#endif
}